

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numsys.cpp
# Opt level: O2

void __thiscall icu_63::NumberingSystem::NumberingSystem(NumberingSystem *this)

{
  ConstChar16Ptr local_70;
  char16_t *local_68;
  UnicodeString defaultDigits;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__NumberingSystem_003c7ef8;
  (this->desc).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003d8fe8;
  (this->desc).fUnion.fStackFields.fLengthAndFlags = 2;
  this->radix = 10;
  this->algorithmic = '\0';
  local_70.p_ = L"0123456789";
  UnicodeString::UnicodeString(&defaultDigits,'\x01',&local_70,-1);
  local_68 = local_70.p_;
  UnicodeString::setTo(&this->desc,&defaultDigits);
  builtin_strncpy(this->name,"latn",5);
  UnicodeString::~UnicodeString(&defaultDigits);
  return;
}

Assistant:

NumberingSystem::NumberingSystem() {
     radix = 10;
     algorithmic = FALSE;
     UnicodeString defaultDigits = DEFAULT_DIGITS;
     desc.setTo(defaultDigits);
     uprv_strcpy(name,gLatn);
}